

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O1

DUH * dumb_read_riff_amff(DUMBFILE *f,riff *stream)

{
  riff_chunk *prVar1;
  undefined1 auVar2 [16];
  char cVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  int32 iVar7;
  DUMB_IT_SIGDATA *sigdata_00;
  IT_PATTERN *pIVar8;
  IT_SAMPLE *pIVar9;
  uchar *puVar10;
  DUH *pDVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0) && (stream->type == 0x414d4646)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    if (stream->chunk_count != 0) {
      uVar15 = 0;
      lVar16 = 8;
      uVar14 = 0;
      do {
        prVar1 = stream->chunks;
        iVar6 = *(int *)((long)prVar1 + lVar16 + -8);
        if (iVar6 < 0x4f524452) {
          if (iVar6 != 0x494e5354) {
            if (iVar6 == 0x4d41494e) {
              iVar6 = 7;
              if (((uVar14 & 1) != 0) || (*(uint *)((long)&prVar1->type + lVar16) < 0x48))
              goto LAB_005ae742;
              uVar14 = uVar14 | 1;
            }
            goto LAB_005ae73f;
          }
          iVar6 = 7;
          if ((0xe0 < *(uint *)((long)&prVar1->type + lVar16)) &&
             (iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4) + 1,0), iVar5 == 0)
             ) {
            iVar5 = dumbfile_getc(f);
            if (sigdata_00->n_samples <= iVar5) {
              sigdata_00->n_samples = iVar5 + 1;
            }
            if (*(uint *)((long)&prVar1->type + lVar16) < 0x121) goto LAB_005ae73f;
            iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4) + 0xe1,0);
            if (iVar5 == 0) {
              iVar7 = dumbfile_mgetl(f);
              if ((iVar7 != 0x53414d50) ||
                 (iVar7 = dumbfile_igetl(f),
                 iVar7 + 0xe9U <= *(uint *)((long)&prVar1->type + lVar16))) goto LAB_005ae73f;
              iVar6 = 7;
            }
          }
        }
        else {
          if (iVar6 == 0x4f524452) {
            iVar6 = 7;
            if (((uVar14 & 2) != 0) || (*(int *)((long)&prVar1->type + lVar16) == 0))
            goto LAB_005ae742;
            uVar14 = uVar14 | 2;
          }
          else if (iVar6 == 0x50415454) {
            iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4),0);
            iVar6 = 7;
            if (iVar5 == 0) {
              iVar5 = dumbfile_getc(f);
              if (sigdata_00->n_patterns <= iVar5) {
                sigdata_00->n_patterns = iVar5 + 1;
              }
              iVar7 = dumbfile_igetl(f);
              if (iVar7 + 5U <= *(uint *)((long)&prVar1->type + lVar16)) goto LAB_005ae73f;
            }
            goto LAB_005ae742;
          }
LAB_005ae73f:
          iVar6 = 0;
        }
LAB_005ae742:
        if (iVar6 != 0) {
          if (iVar6 == 7) goto LAB_005aecd5;
          goto LAB_005aecdf;
        }
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 0x18;
      } while (uVar15 < stream->chunk_count);
      if ((((uVar14 == 3) && (sigdata_00->n_samples != 0)) && (sigdata_00->n_patterns < 0x100)) &&
         ((sigdata_00->n_samples < 0x100 && (sigdata_00->n_patterns != 0)))) {
        sigdata_00->song_message = (uchar *)0x0;
        sigdata_00->n_orders = 0;
        sigdata_00->n_instruments = 0;
        sigdata_00->order = (uchar *)0x0;
        sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
        sigdata_00->sample = (IT_SAMPLE *)0x0;
        sigdata_00->pattern = (IT_PATTERN *)0x0;
        sigdata_00->midi = (IT_MIDI *)0x0;
        sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
        sigdata_00->mixing_volume = 0x30;
        sigdata_00->pan_separation = 0x80;
        sigdata_00->restart_position = '\0';
        builtin_memcpy(sigdata_00->channel_volume,
                       "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
        cVar3 = (char)(uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f)
                            >> 0x25) - (char)((dumb_it_default_panning_separation << 5) >> 0x1f);
        bVar12 = 0x20 - cVar3;
        uVar15 = (ulong)bVar12;
        uVar4 = cVar3 + ' ';
        uVar13 = 0xfffffffffffffffc;
        do {
          sigdata_00->channel_pan[uVar13 + 4] = bVar12;
          sigdata_00->channel_pan[uVar13 + 5] = uVar4;
          sigdata_00->channel_pan[uVar13 + 6] = uVar4;
          sigdata_00->channel_pan[uVar13 + 7] = bVar12;
          uVar13 = uVar13 + 4;
        } while (uVar13 < 0x3c);
        if (stream->chunk_count != 0) {
          uVar13 = 0;
          do {
            prVar1 = stream->chunks;
            uVar15 = uVar13 * 3;
            iVar6 = 0;
            if (prVar1[uVar13].type == 0x4d41494e) {
              iVar5 = dumbfile_seek(f,(long)prVar1[uVar13].offset,0);
              iVar6 = 0xf;
              if (iVar5 == 0) {
                dumbfile_getnc((char *)sigdata_00,0x40,f);
                sigdata_00->name[0x40] = '\0';
                sigdata_00->flags = 0x131;
                uVar14 = dumbfile_getc(f);
                if ((uVar14 & 1) == 0) {
                  *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
                }
                if ((uVar14 & 0xfffffffe) == 2) {
                  iVar5 = dumbfile_getc(f);
                  sigdata_00->n_pchannels = iVar5;
                  iVar5 = dumbfile_getc(f);
                  sigdata_00->speed = iVar5;
                  iVar5 = dumbfile_getc(f);
                  sigdata_00->tempo = iVar5;
                  dumbfile_skip(f,4);
                  iVar5 = dumbfile_getc(f);
                  sigdata_00->global_volume = iVar5;
                  uVar14 = sigdata_00->n_pchannels + 0x48;
                  uVar15 = (ulong)uVar14;
                  if ((uVar14 <= prVar1[uVar13].size) && (iVar6 = 0, 0 < sigdata_00->n_pchannels)) {
                    lVar16 = 0;
                    do {
                      iVar6 = dumbfile_getc(f);
                      sigdata_00->channel_pan[lVar16] = (uchar)iVar6;
                      if (0x7f < iVar6) {
                        sigdata_00->channel_volume[lVar16] = '\0';
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < sigdata_00->n_pchannels);
                    iVar6 = 0;
                  }
                }
              }
            }
            if (iVar6 != 0) {
              if (iVar6 == 0xf) goto LAB_005aed45;
              goto LAB_005aecdf;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < stream->chunk_count);
        }
        iVar6 = sigdata_00->n_patterns;
        pIVar8 = (IT_PATTERN *)malloc((long)iVar6 << 4);
        sigdata_00->pattern = pIVar8;
        auVar2 = _DAT_005d8eb0;
        if (pIVar8 != (IT_PATTERN *)0x0) {
          if (0 < iVar6) {
            lVar16 = (long)iVar6 + -1;
            auVar17._8_4_ = (int)lVar16;
            auVar17._0_8_ = lVar16;
            auVar17._12_4_ = (int)((ulong)lVar16 >> 0x20);
            uVar15 = (ulong)(iVar6 + 1U >> 1) << 5;
            uVar13 = 0;
            auVar17 = auVar17 ^ _DAT_005d8eb0;
            auVar18 = _DAT_00632e10;
            do {
              auVar19 = auVar18 ^ auVar2;
              if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                          auVar17._4_4_ < auVar19._4_4_) & 1)) {
                *(undefined8 *)((long)&pIVar8->entry + uVar13) = 0;
              }
              if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
                  auVar19._12_4_ <= auVar17._12_4_) {
                *(undefined8 *)((long)&pIVar8[1].entry + uVar13) = 0;
              }
              lVar16 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 2;
              auVar18._8_8_ = lVar16 + 2;
              uVar13 = uVar13 + 0x20;
            } while (uVar15 != uVar13);
          }
          iVar6 = sigdata_00->n_samples;
          pIVar9 = (IT_SAMPLE *)malloc((long)iVar6 * 0x68);
          sigdata_00->sample = pIVar9;
          if (pIVar9 != (IT_SAMPLE *)0x0) {
            if (0 < iVar6) {
              uVar15 = 0;
              lVar16 = 0;
              do {
                pIVar9 = sigdata_00->sample;
                puVar10 = pIVar9->filename + uVar15 + 0x35;
                puVar10[0] = '\0';
                puVar10[1] = '\0';
                puVar10[2] = '\0';
                puVar10[3] = '\0';
                puVar10[4] = '\0';
                puVar10[5] = '\0';
                puVar10[6] = '\0';
                puVar10[7] = '\0';
                pIVar9->filename[uVar15 + 0xf] = '\0';
                pIVar9->name[uVar15] = '\0';
                lVar16 = lVar16 + 1;
                uVar15 = uVar15 + 0x68;
              } while (lVar16 < sigdata_00->n_samples);
            }
            if (stream->chunk_count != 0) {
              lVar16 = 8;
              uVar13 = 0;
              do {
                prVar1 = stream->chunks;
                iVar6 = *(int *)((long)prVar1 + lVar16 + -8);
                if (iVar6 == 0x494e5354) {
                  iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4) + 1,0);
                  iVar6 = 0xf;
                  if (iVar5 == 0) {
                    pIVar9 = sigdata_00->sample;
                    iVar5 = dumbfile_getc(f);
                    pIVar9 = pIVar9 + iVar5;
                    if (*(uint *)((long)&prVar1->type + lVar16) < 0x121) {
LAB_005aec32:
                      iVar6 = 0;
                      dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4) + 2,0);
                      dumbfile_getnc((char *)pIVar9,0x1c,f);
                      pIVar9->name[0x1c] = '\0';
                    }
                    else {
                      iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4) + 0xe1,0);
                      if (iVar5 == 0) {
                        iVar7 = dumbfile_mgetl(f);
                        if (iVar7 != 0x53414d50) goto LAB_005aec32;
                        iVar7 = dumbfile_igetl(f);
                        iVar5 = it_riff_am_process_sample(pIVar9,f,iVar7,(int)uVar15);
                        iVar6 = 0xf;
                        if (iVar5 == 0) {
                          iVar6 = 0x1c;
                        }
                      }
                    }
                  }
                  iVar5 = iVar6;
                  if (iVar6 != 0x1c) {
joined_r0x005aec66:
                    if (iVar5 != 0) goto LAB_005aec97;
                  }
LAB_005aec95:
                  iVar6 = 0;
                }
                else if (iVar6 == 0x50415454) {
                  iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4),0);
                  iVar6 = 0xf;
                  if (iVar5 == 0) {
                    iVar5 = dumbfile_getc(f);
                    iVar7 = dumbfile_igetl(f);
                    uVar15 = 0;
                    iVar5 = it_riff_am_process_pattern(sigdata_00->pattern + iVar5,f,iVar7,0);
                    goto joined_r0x005aec66;
                  }
                }
                else {
                  if (iVar6 != 0x4f524452) goto LAB_005aec95;
                  iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar16 + -4),0);
                  iVar6 = 0xf;
                  if (iVar5 == 0) {
                    iVar5 = dumbfile_getc(f);
                    uVar14 = iVar5 + 1;
                    uVar15 = (ulong)uVar14;
                    sigdata_00->n_orders = uVar14;
                    if (iVar5 + 2U <= *(uint *)((long)&prVar1->type + lVar16)) {
                      puVar10 = (uchar *)malloc((long)(int)uVar14);
                      sigdata_00->order = puVar10;
                      if (puVar10 != (uchar *)0x0) {
                        dumbfile_getnc((char *)puVar10,uVar14,f);
                        goto LAB_005aec95;
                      }
                    }
                  }
                }
LAB_005aec97:
                if (iVar6 != 0) {
                  if (iVar6 != 0xf) goto LAB_005aecdf;
                  goto LAB_005aed45;
                }
                uVar13 = uVar13 + 1;
                lVar16 = lVar16 + 0x18;
              } while (uVar13 < stream->chunk_count);
            }
            _dumb_it_fix_invalid_orders(sigdata_00);
            goto LAB_005aecdf;
          }
        }
LAB_005aed45:
        _dumb_it_unload_sigdata(sigdata_00);
        goto LAB_005aecdd;
      }
    }
LAB_005aecd5:
    free(sigdata_00);
  }
LAB_005aecdd:
  sigdata_00 = (DUMB_IT_SIGDATA *)0x0;
LAB_005aecdf:
  if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
    pDVar11 = (DUH *)0x0;
  }
  else {
    local_58 = "TITLE";
    local_48 = "FORMAT";
    local_40 = "RIFF AMFF";
    local_60 = sigdata_00;
    local_50 = sigdata_00;
    pDVar11 = make_duh(0,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
  }
  return pDVar11;
}

Assistant:

DUH *dumb_read_riff_amff( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;
	long length;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_amff_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	length = 0;/*_dumb_it_build_checkpoints(sigdata, 0);*/

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AMFF";
		return make_duh( length, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}